

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Arguments *args_00;
  Arguments *in_RSI;
  Arguments args;
  int file_descriptor;
  void *file_memory;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 in_stack_ffffffffffffffe8;
  
  parse_arguments(in_RSI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                  (char **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar1 = get_file_descriptor();
  args_00 = (Arguments *)mmap((void *)0x0,(long)local_24,3,1,iVar1,0);
  iVar1 = close(iVar1);
  if (iVar1 < 0) {
    throw((char *)0x101415);
  }
  communicate((char *)in_RSI,args_00);
  iVar1 = munmap(args_00,(long)local_24);
  if (-1 < iVar1) {
    remove("/tmp/mmap");
    return 0;
  }
  throw((char *)0x101444);
}

Assistant:

int main(int argc, char* argv[]) {
	// The memory region to which the file will be mapped
	void* file_memory;
	// The file descriptor of the file we will
	// map into our process's memory
	int file_descriptor;
	// Fetch command-line arguments
	struct Arguments args;

	parse_arguments(&args, argc, argv);
	file_descriptor = get_file_descriptor();

	/*
		Arguments:
		1: Where to map the file to in the process' address
			 space; NULL = let the OS find a region
		2: The size of the file in bytes
		3: The access rights, a bitwise OR of: PROT_READ, PROT_WRITE and PROT_EXEC
		4: Flags for the mapped memory, a bitwise OR of:
			 * MAP_FIXED: don't take the first argument as a hint, but really map
				 the file there; you must ensure page-alignment,
			 * MAP_PRIVATE: make a copy of the file if a write
				 occurs, i.e. the actual file will never change, only the *local* copy,
			 * MAP_SHARED: flush modified data to the underlying
				 file immediately, instead of buffering; necessary for IPC!.
				 Without MAP_SHARED, writes may be buffered by the OS.
			 * MAP_FILE: the default (zero) flag.
		5: The file descriptor to the opened file.
		6: The offset from the beginnning in the file, starting from which to map.
	*/
	// clang-format off
  file_memory = mmap(
		NULL,
		args.size,
		PROT_READ | PROT_WRITE,
		MAP_SHARED,
		file_descriptor,
	  0
	 );
	// clang-format on

	if (file_memory < 0) {
		throw("Error mapping file!");
	}

	/*
		If you do not specify MAP_SHARED, but just MAP_FILE (the default),
		writes may be buffered by the OS. You can then flush the memory manually
		by calling msync(memory_address, memory_length, flags), where flags is the
		combination of:
		* MS_SYNC: Flush immediately, blocking until it's done.
		* MS_ASYNC: Schedule a flush, but the buffer may not necessarily have been
			flushed before the call to msync returns.
		* MS_INVALIDATE: Invalidate all other process' cached data, so the change
			will be visible to them.
		Usually one would use: MS_SYNC | MS_INVALIDATE, so:
		msync(file_memory, FILE_SIZE, MS_SYNC | MS_INVALIDATE);
	*/


	// Don't need the file descriptor anymore at this point
	if (close(file_descriptor) < 0) {
		throw("Error closing file!");
	}

	communicate(file_memory, &args);

	// Unmap the file from the process memory
	// Actually unncessary because the OS will do
	// this automatically when the process terminates
	if (munmap(file_memory, args.size) < 0) {
		throw("Error unmapping file!");
	}

	remove("/tmp/mmap");

	return EXIT_SUCCESS;
}